

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.h
# Opt level: O3

__pid_t __thiscall sznet::Condition::wait(Condition *this,void *__stat_loc)

{
  sz_mutex_t *mutex;
  int iVar1;
  __pid_t extraout_EAX;
  SourceFile file;
  Logger local_fe8;
  
  mutex = &this->m_mutex->m_mutex;
  mutex[1].__data.__lock = 0;
  iVar1 = sz_cond_wait(&this->m_cond,mutex);
  if (iVar1 != 0) {
    file._8_8_ = 0xb;
    file.m_data = "Condition.h";
    Logger::Logger(&local_fe8,file,0x22,true);
    if (0x16 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"Failed in sz_cond_wait",0x16);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x16;
    }
    Logger::~Logger(&local_fe8);
  }
  MutexLock::assignHolder((MutexLock *)&mutex->__data);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		MutexLock::UnassignGuard ug(m_mutex);
		auto rst = sz_cond_wait(&m_cond, m_mutex.getPthreadMutex());
		if (rst != 0)
		{
			LOG_SYSFATAL << "Failed in sz_cond_wait";
		}
	}